

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::SkeletonWriter::DoPutSync
          (SkeletonWriter *this,Variable<unsigned_char> *variable,uint8_t *data)

{
  size_t stepsStart;
  BPInfo *blockInfo;
  
  stepsStart = CurrentStep(this);
  blockInfo = Variable<unsigned_char>::SetBlockInfo(variable,data,stepsStart,1);
  PutSyncCommon<unsigned_char>(this,variable,blockInfo);
  std::
  vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  ::clear(&variable->m_BlocksInfo);
  return;
}

Assistant:

void SkeletonWriter::Init()
{
    InitParameters();
    InitTransports();
}